

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_low_entropy_ref(aec_stream_conflict *strm)

{
  uint32_t uVar1;
  long in_RDI;
  internal_state_conflict *state;
  aec_stream_conflict *strm_00;
  
  strm_00 = *(aec_stream_conflict **)(in_RDI + 0x40);
  if (((int)strm_00[1].avail_in != 0) && (uVar1 = copysample(strm_00), uVar1 == 0)) {
    return 0;
  }
  if ((int)strm_00->avail_in == 1) {
    strm_00->next_in = (uchar *)m_se;
  }
  else {
    strm_00->next_in = (uchar *)m_zero_block;
  }
  return 1;
}

Assistant:

static int m_low_entropy_ref(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->ref && copysample(strm) == 0)
        return M_EXIT;

    if(state->id == 1) {
        state->mode = m_se;
        return M_CONTINUE;
    }

    state->mode = m_zero_block;
    return M_CONTINUE;
}